

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

int BackwardRefsClone(VP8LBackwardRefs *from,VP8LBackwardRefs *to)

{
  PixOrCopyBlock *pPVar1;
  
  if (to->tail_ != (PixOrCopyBlock **)0x0) {
    *to->tail_ = to->free_blocks_;
  }
  to->free_blocks_ = to->refs_;
  to->tail_ = &to->refs_;
  to->last_block_ = (PixOrCopyBlock *)0x0;
  to->refs_ = (PixOrCopyBlock *)0x0;
  while( true ) {
    if (from == (VP8LBackwardRefs *)0x0) {
      return 1;
    }
    pPVar1 = BackwardRefsNewBlock(to);
    if (pPVar1 == (PixOrCopyBlock *)0x0) break;
    memcpy(pPVar1->start_,from->refs_,(long)*(int *)&from->tail_ << 3);
    pPVar1->size_ = *(int *)&from->tail_;
    from = *(VP8LBackwardRefs **)from;
  }
  return 0;
}

Assistant:

static int BackwardRefsClone(const VP8LBackwardRefs* const from,
                             VP8LBackwardRefs* const to) {
  const PixOrCopyBlock* block_from = from->refs_;
  VP8LClearBackwardRefs(to);
  while (block_from != NULL) {
    PixOrCopyBlock* const block_to = BackwardRefsNewBlock(to);
    if (block_to == NULL) return 0;
    memcpy(block_to->start_, block_from->start_,
           block_from->size_ * sizeof(PixOrCopy));
    block_to->size_ = block_from->size_;
    block_from = block_from->next_;
  }
  return 1;
}